

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O2

PipelineResourceLayoutDescX * __thiscall
Diligent::PipelineResourceLayoutDescX::SyncDesc
          (PipelineResourceLayoutDescX *this,bool UpdateStrings)

{
  pointer pIVar1;
  Uint32 UVar2;
  long lVar3;
  pointer pIVar4;
  long lVar5;
  undefined7 in_register_00000031;
  iterator __begin3;
  pointer pIVar6;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar7;
  
  pIVar6 = (pointer)(this->VarCopy).
                    super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (pointer)(this->VarCopy).
                    super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  UVar2 = (Uint32)((ulong)((long)pIVar1 - (long)pIVar6) >> 4);
  pIVar4 = pIVar6;
  if (UVar2 == 0) {
    pIVar4 = (pointer)0x0;
  }
  (this->super_PipelineResourceLayoutDesc).NumVariables = UVar2;
  (this->super_PipelineResourceLayoutDesc).Variables = (ShaderResourceVariableDesc *)pIVar4;
  pIVar4 = (this->ImtblSamCopy).
           super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->ImtblSamCopy).
                super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar4;
  lVar5 = lVar3 % 0x48;
  UVar2 = (Uint32)(lVar3 / 0x48);
  (this->super_PipelineResourceLayoutDesc).NumImmutableSamplers = UVar2;
  if (UVar2 == 0) {
    pIVar4 = (pointer)0x0;
  }
  (this->super_PipelineResourceLayoutDesc).ImmutableSamplers = pIVar4;
  if ((int)CONCAT71(in_register_00000031,UpdateStrings) != 0) {
    for (; pIVar6 != pIVar1; pIVar6 = (pointer)&pIVar6->Desc) {
      pVar7 = std::
              _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::_M_emplace<char_const*&>
                        ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)&this->StringPool,pIVar6,lVar5);
      lVar5 = pVar7._8_8_;
      *(undefined8 *)pIVar6 =
           *(undefined8 *)
            ((long)pVar7.first.
                   super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ._M_cur.
                   super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            + 8);
    }
    pIVar1 = (this->ImtblSamCopy).
             super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pIVar6 = (this->ImtblSamCopy).
                  super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                  ._M_impl.super__Vector_impl_data._M_start; pIVar6 != pIVar1; pIVar6 = pIVar6 + 1)
    {
      pVar7 = std::
              _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::_M_emplace<char_const*&>
                        ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)&this->StringPool,&pIVar6->SamplerOrTextureName,lVar5);
      lVar5 = pVar7._8_8_;
      pIVar6->SamplerOrTextureName =
           *(Char **)((long)pVar7.first.
                            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            ._M_cur.
                            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     + 8);
    }
  }
  return this;
}

Assistant:

PipelineResourceLayoutDescX& SyncDesc(bool UpdateStrings = false)
    {
        NumVariables = static_cast<Uint32>(VarCopy.size());
        Variables    = NumVariables > 0 ? VarCopy.data() : nullptr;

        NumImmutableSamplers = static_cast<Uint32>(ImtblSamCopy.size());
        ImmutableSamplers    = NumImmutableSamplers > 0 ? ImtblSamCopy.data() : nullptr;

        if (UpdateStrings)
        {
            for (auto& Var : VarCopy)
                Var.Name = StringPool.emplace(Var.Name).first->c_str();

            for (auto& Sam : ImtblSamCopy)
                Sam.SamplerOrTextureName = StringPool.emplace(Sam.SamplerOrTextureName).first->c_str();
        }

        return *this;
    }